

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareDestinationTextureAndFramebuffer
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  TextureInternalFormatDescriptor descriptor_00;
  TextureInternalFormatDescriptor descriptor_01;
  TextureInternalFormatDescriptor descriptor_02;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined8 local_100 [2];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 *local_80;
  GLvoid *destination_data;
  GLenum destination_type;
  GLenum destination_format;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  GLenum local_2c;
  long lStack_28;
  GLenum internal_format;
  Functions *gl;
  FunctionalTest *pFStack_18;
  GLenum target_local;
  FunctionalTest *this_local;
  
  gl._4_4_ = target;
  pFStack_18 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  memcpy(&destination_type,&descriptor,0x40);
  descriptor_00.internal_format_name._0_4_ = (int)uStack_68;
  descriptor_00.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)destination_type;
  descriptor_00.internal_format = destination_format;
  descriptor_00.internal_format_name._4_4_ = (int)((ulong)uStack_68 >> 0x20);
  descriptor_00.is_sRGB = (bool)(undefined1)local_60;
  descriptor_00.is_color_renderable = (bool)local_60._1_1_;
  descriptor_00._18_2_ = local_60._2_2_;
  descriptor_00.min_red_size = local_60._4_4_;
  descriptor_00.min_green_size = (undefined4)uStack_58;
  descriptor_00.min_blue_size = uStack_58._4_4_;
  descriptor_00.min_alpha_size = (undefined4)local_50;
  descriptor_00.min_depth_size = local_50._4_4_;
  descriptor_00.min_stencil_size = (undefined4)uStack_48;
  descriptor_00.expected_red_type = uStack_48._4_4_;
  descriptor_00.expected_green_type = (undefined4)local_40;
  descriptor_00.expected_blue_type = local_40._4_4_;
  descriptor_00.expected_alpha_type = (undefined4)uStack_38;
  descriptor_00.expected_depth_type = uStack_38._4_4_;
  local_2c = getDestinationFormatForChannel(this,descriptor_00);
  (**(code **)(lStack_28 + 0x6d0))(1,&this->m_framebuffer);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x186);
  (**(code **)(lStack_28 + 0x78))(0x8d40,this->m_framebuffer);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x189);
  (**(code **)(lStack_28 + 0x6f8))(1,&this->m_destination_texture);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x18d);
  (**(code **)(lStack_28 + 0xb8))(gl._4_4_,this->m_destination_texture);
  dVar3 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,400);
  if (gl._4_4_ == 0xde1) {
    destination_data._4_4_ = 0x1903;
    destination_data._0_4_ = 0x1406;
    local_80 = &s_destination_texture_data_f;
    memcpy(local_c0,&descriptor,0x40);
    descriptor_01.internal_format_name._0_4_ = (int)local_c0[1];
    descriptor_01.required_by_context.super_ApiType.m_bits =
         (ApiType)(ApiType)(undefined4)local_c0[0];
    descriptor_01.internal_format = local_c0[0]._4_4_;
    descriptor_01.internal_format_name._4_4_ = (int)((ulong)local_c0[1] >> 0x20);
    descriptor_01.is_sRGB = (bool)(undefined1)local_b0;
    descriptor_01.is_color_renderable = (bool)local_b0._1_1_;
    descriptor_01._18_2_ = local_b0._2_2_;
    descriptor_01.min_red_size = local_b0._4_4_;
    descriptor_01.min_green_size = (undefined4)uStack_a8;
    descriptor_01.min_blue_size = uStack_a8._4_4_;
    descriptor_01.min_alpha_size = (undefined4)local_a0;
    descriptor_01.min_depth_size = local_a0._4_4_;
    descriptor_01.min_stencil_size = (undefined4)uStack_98;
    descriptor_01.expected_red_type = uStack_98._4_4_;
    descriptor_01.expected_green_type = (undefined4)local_90;
    descriptor_01.expected_blue_type = local_90._4_4_;
    descriptor_01.expected_alpha_type = (undefined4)uStack_88;
    descriptor_01.expected_depth_type = uStack_88._4_4_;
    bVar1 = isIntegerSignedType(this,descriptor_01);
    if (bVar1) {
      destination_data._4_4_ = 0x8d94;
      destination_data._0_4_ = 0x1404;
      local_80 = &s_destination_texture_data_i;
    }
    memcpy(local_100,&descriptor,0x40);
    descriptor_02.internal_format_name._0_4_ = (int)local_100[1];
    descriptor_02.required_by_context.super_ApiType.m_bits =
         (ApiType)(ApiType)(undefined4)local_100[0];
    descriptor_02.internal_format = local_100[0]._4_4_;
    descriptor_02.internal_format_name._4_4_ = (int)((ulong)local_100[1] >> 0x20);
    descriptor_02.is_sRGB = (bool)(undefined1)local_f0;
    descriptor_02.is_color_renderable = (bool)local_f0._1_1_;
    descriptor_02._18_2_ = local_f0._2_2_;
    descriptor_02.min_red_size = local_f0._4_4_;
    descriptor_02.min_green_size = (undefined4)uStack_e8;
    descriptor_02.min_blue_size = uStack_e8._4_4_;
    descriptor_02.min_alpha_size = (undefined4)local_e0;
    descriptor_02.min_depth_size = local_e0._4_4_;
    descriptor_02.min_stencil_size = (undefined4)uStack_d8;
    descriptor_02.expected_red_type = uStack_d8._4_4_;
    descriptor_02.expected_green_type = (undefined4)local_d0;
    descriptor_02.expected_blue_type = local_d0._4_4_;
    descriptor_02.expected_alpha_type = (undefined4)uStack_c8;
    descriptor_02.expected_depth_type = uStack_c8._4_4_;
    bVar1 = isIntegerUnsignedType(this,descriptor_02);
    if (bVar1) {
      destination_data._4_4_ = 0x8d94;
      destination_data._0_4_ = 0x1405;
      local_80 = &s_destination_texture_data_ui;
    }
    (**(code **)(lStack_28 + 0x1310))
              (gl._4_4_,0,local_2c,1,1,0,destination_data._4_4_,destination_data._0_4_,local_80);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1a9);
    (**(code **)(lStack_28 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_destination_texture,0);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glFramebufferTexture2D have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1ac);
  }
  else if (gl._4_4_ == 0x9100) {
    (**(code **)(lStack_28 + 0x1318))
              (0x9100,this->m_max_samples + -1,descriptor.internal_format,1,1);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1b4);
    (**(code **)(lStack_28 + 0x6a0))(0x8d40,0x8ce0,gl._4_4_,this->m_destination_texture,0);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glFramebufferTexture2D have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1b7);
  }
  else {
    (**(code **)(lStack_28 + 0x1328))
              (gl._4_4_,this->m_max_samples + -1,descriptor.internal_format,1,1,1,1);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glGetTexLevelParameteriv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1bd);
    (**(code **)(lStack_28 + 0x6b8))(0x8d40,0x8ce0,this->m_destination_texture,0);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glFramebufferTexture2D have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1c0);
  }
  iVar2 = (**(code **)(lStack_28 + 0x170))(0x8d40);
  if (iVar2 == 0x8cd5) {
    (**(code **)(lStack_28 + 0x1a00))(0,0,1);
    dVar3 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar3,"glViewport call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                    ,0x1cc);
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::prepareDestinationTextureAndFramebuffer(TextureInternalFormatDescriptor descriptor,
															 glw::GLenum					 target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get internal format. */
	glw::GLenum internal_format = getDestinationFormatForChannel(descriptor);

	/* Create framebuffer object. */
	gl.genFramebuffers(1, &m_framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Create framebuffer's destination texture. */
	gl.genTextures(1, &m_destination_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	gl.bindTexture(target, m_destination_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* Allocate texture storage and upload data for test rendering. */
	if (target == GL_TEXTURE_2D)
	{
		glw::GLenum  destination_format = GL_RED;
		glw::GLenum  destination_type   = GL_FLOAT;
		glw::GLvoid* destination_data   = (glw::GLvoid*)s_destination_texture_data_f;

		if (isIntegerSignedType(descriptor))
		{
			destination_format = GL_RED_INTEGER;
			destination_type   = GL_INT;
			destination_data   = (glw::GLvoid*)s_destination_texture_data_i;
		}

		if (isIntegerUnsignedType(descriptor))
		{
			destination_format = GL_RED_INTEGER;
			destination_type   = GL_UNSIGNED_INT;
			destination_data   = (glw::GLvoid*)s_destination_texture_data_ui;
		}

		gl.texImage2D(target, 0, internal_format, s_source_texture_size, s_source_texture_size, 0, destination_format,
					  destination_type, destination_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_destination_texture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
	}
	else /* Allocate texture storage for uploading datat for multisampled targets (upload must be done via shader). */
	{
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
		{
			gl.texImage2DMultisample(target, m_max_samples - 1, descriptor.internal_format, s_source_texture_size,
									 s_source_texture_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, m_destination_texture, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
		}
		else
		{
			gl.texImage3DMultisample(target, m_max_samples - 1, descriptor.internal_format, s_source_texture_size,
									 s_source_texture_size, s_source_texture_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

			gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_destination_texture, 0, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D have failed");
		}
	}

	/* Check framebuffer completness. */
	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	/* Setup viewport. */
	gl.viewport(0, 0, s_source_texture_size, s_source_texture_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}